

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_utility.c
# Opt level: O0

uint TA_GetUnstablePeriod(TA_FuncUnstId id)

{
  TA_FuncUnstId id_local;
  uint local_4;
  
  if (id < TA_FUNC_UNST_ALL) {
    local_4 = TA_Globals->unstablePeriod[id];
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned int TA_GetUnstablePeriod( TA_FuncUnstId id )
#endif
{
   if( id >= ENUM_VALUE(FuncUnstId,TA_FUNC_UNST_ALL,FuncUnstAll) )
	   return 0;

   #if defined( _MANAGED )
      return Globals->unstablePeriod[(int)id];
   #else
      return TA_Globals->unstablePeriod[id];
   #endif
}